

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<unsigned_short>::push_back(PropertyT<unsigned_short> *this)

{
  value_type_conflict6 local_12;
  PropertyT<unsigned_short> *local_10;
  PropertyT<unsigned_short> *this_local;
  
  local_12 = 0;
  local_10 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&this->data_,&local_12);
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }